

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O3

ShaderProgram *
deqp::gls::anon_unknown_1::createRenderProgram(RenderContext *renderContext,RenderBits renderBits)

{
  ContextType type;
  GLSLVersion glslVersion;
  ShaderProgram *this;
  long lVar1;
  char *pcVar2;
  bool bVar3;
  string fragmentShaderSource;
  string vertexShaderSource;
  string fragmentShaderTemplate;
  string vertexShaderTemplate;
  ProgramSources sources;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [112];
  ios_base local_128 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_108;
  undefined1 local_e8 [200];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"${VERSION_HEADER}\n",0x12);
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) != RENDERBITS_NONE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"${TEXTURE_BUFFER_EXT}",0x15);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "${VTX_INPUT} layout(location = 0) ${HIGHP} vec2 i_coord;\n${VTX_OUTPUT} ${HIGHP} vec4 v_color;\n"
             ,0x5e);
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) != RENDERBITS_NONE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"uniform ${HIGHP} samplerBuffer u_vtxSampler;\n",0x2d);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\nvoid main (void)\n{\n",0x14);
  bVar3 = (renderBits & RENDERBITS_AS_VERTEX_TEXTURE) == RENDERBITS_NONE;
  pcVar2 = 
  "\tv_color = texelFetch(u_vtxSampler, clamp((int(round(i_coord.x * 4.0)) + 4) * (int(round(i_coord.y * 4.0)) + 4), 0, textureSize(u_vtxSampler)-1));\n"
  ;
  if (bVar3) {
    pcVar2 = "\tv_color = vec4(1.0);\n";
  }
  lVar1 = 0x93;
  if (bVar3) {
    lVar1 = 0x16;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "\tgl_Position = vec4(2.0 * (i_coord - vec2(0.5)), 0.0, 1.0);\n}\n",0x3e);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"${VERSION_HEADER}\n",0x12);
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) != RENDERBITS_NONE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"${TEXTURE_BUFFER_EXT}",0x15);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "${FRAG_OUTPUT} layout(location = 0) ${HIGHP} vec4 dEQP_FragColor;\n${FRAG_INPUT} ${HIGHP} vec4 v_color;\n"
             ,0x67);
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) != RENDERBITS_NONE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"uniform ${HIGHP} samplerBuffer u_fragSampler;\n",0x2e);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\nvoid main (void)\n{\n",0x14);
  bVar3 = (renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) == RENDERBITS_NONE;
  pcVar2 = 
  "\t${HIGHP} vec4 color = 0.5 * (v_color + texelFetch(u_fragSampler, clamp(int(gl_FragCoord.x) * int(gl_FragCoord.y), 0, textureSize(u_fragSampler)-1)));\n"
  ;
  if (bVar3) {
    pcVar2 = "\t${HIGHP} vec4 color = v_color;\n";
  }
  lVar1 = 0x97;
  if (bVar3) {
    lVar1 = 0x20;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\tdEQP_FragColor = vec4(color.xyz * color.w, 1.0);\n}\n",0x34);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  type.super_ApiType.m_bits = (ApiType)(*renderContext->_vptr_RenderContext[2])(renderContext);
  glslVersion = glu::getContextTypeGLSLVersion(type);
  specializeShader(&local_1f8,&local_1b8,glslVersion);
  specializeShader(&local_218,&local_1d8,glslVersion);
  this = (ShaderProgram *)operator_new(0xd0);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_198,0,0xac);
  local_e8._0_8_ = (pointer)0x0;
  local_e8[8] = 0;
  local_e8._9_7_ = 0;
  local_e8[0x10] = 0;
  local_e8._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_198,&local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_198 + 0x18),&local_218);
  glu::ShaderProgram::ShaderProgram(this,renderContext,(ProgramSources *)local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_108);
  lVar1 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_198 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

glu::ShaderProgram* createRenderProgram (glu::RenderContext&	renderContext,
										 RenderBits				renderBits)
{
	const string				vertexShaderTemplate	= generateVertexShaderTemplate(renderBits);
	const string				fragmentShaderTemplate	= generateFragmentShaderTemplate(renderBits);

	const glu::GLSLVersion		glslVersion				= glu::getContextTypeGLSLVersion(renderContext.getType());

	const string				vertexShaderSource		= specializeShader(vertexShaderTemplate, glslVersion);
	const string				fragmentShaderSource	= specializeShader(fragmentShaderTemplate, glslVersion);

	glu::ShaderProgram* const	program					= new glu::ShaderProgram(renderContext, glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));

	return program;
}